

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableFormatter.cpp
# Opt level: O2

void __thiscall cali::TableFormatter::~TableFormatter(TableFormatter *this)

{
  (this->super_Formatter)._vptr_Formatter = (_func_int **)&PTR__TableFormatter_0028fcb0;
  std::__shared_ptr<cali::TableFormatter::TableImpl,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->mP).
              super___shared_ptr<cali::TableFormatter::TableImpl,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->mP).
              super___shared_ptr<cali::TableFormatter::TableImpl,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TableFormatter::~TableFormatter()
{
    mP.reset();
}